

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fs_event.c
# Opt level: O0

int luv_fs_event_start(lua_State *L)

{
  int iVar1;
  uv_fs_event_t *handle_00;
  char *path_00;
  uint local_2c;
  int ret;
  int flags;
  char *path;
  uv_fs_event_t *handle;
  lua_State *L_local;
  
  handle_00 = luv_check_fs_event(L,1);
  path_00 = luaL_checklstring(L,2,(size_t *)0x0);
  luaL_checktype(L,3,5);
  lua_getfield(L,3,"watch_entry");
  iVar1 = lua_toboolean(L,-1);
  local_2c = (uint)(iVar1 != 0);
  lua_settop(L,-2);
  lua_getfield(L,3,"stat");
  iVar1 = lua_toboolean(L,-1);
  if (iVar1 != 0) {
    local_2c = local_2c | 2;
  }
  lua_settop(L,-2);
  lua_getfield(L,3,"recursive");
  iVar1 = lua_toboolean(L,-1);
  if (iVar1 != 0) {
    local_2c = local_2c | 4;
  }
  lua_settop(L,-2);
  luv_check_callback(L,(luv_handle_t *)handle_00->data,1,4);
  iVar1 = uv_fs_event_start(handle_00,luv_fs_event_cb,path_00,local_2c);
  if (iVar1 < 0) {
    L_local._4_4_ = luv_error(L,iVar1);
  }
  else {
    lua_pushinteger(L,(long)iVar1);
    L_local._4_4_ = 1;
  }
  return L_local._4_4_;
}

Assistant:

static int luv_fs_event_start(lua_State* L) {
  uv_fs_event_t* handle = luv_check_fs_event(L, 1);
  const char* path = luaL_checkstring(L, 2);
  int flags = 0, ret;
  luaL_checktype(L, 3, LUA_TTABLE);
  lua_getfield(L, 3, "watch_entry");
  if (lua_toboolean(L, -1)) flags |= UV_FS_EVENT_WATCH_ENTRY;
  lua_pop(L, 1);
  lua_getfield(L, 3, "stat");
  if (lua_toboolean(L, -1)) flags |= UV_FS_EVENT_STAT;
  lua_pop(L, 1);
  lua_getfield(L, 3, "recursive");
  if (lua_toboolean(L, -1)) flags |= UV_FS_EVENT_RECURSIVE;
  lua_pop(L, 1);
  luv_check_callback(L, (luv_handle_t*)handle->data, LUV_FS_EVENT, 4);
  ret = uv_fs_event_start(handle, luv_fs_event_cb, path, flags);
  return luv_result(L, ret);
}